

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit_reporter.h
# Opt level: O0

void __thiscall bandit::detail::xunit_reporter::it_skip(xunit_reporter *this,char *desc)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [48];
  undefined1 local_58 [32];
  _List_node_base *local_18;
  char *desc_local;
  xunit_reporter *this_local;
  
  local_18 = (_List_node_base *)desc;
  desc_local = (char *)this;
  progress_reporter::it_skip(&this->super_progress_reporter,desc);
  poVar2 = std::operator<<((ostream *)&this->field_0x80,"\t<testcase classname=\"");
  progress_reporter::current_context_name_abi_cxx11_((progress_reporter *)local_58);
  escape((xunit_reporter *)&stack0xffffffffffffffc8,(string *)this);
  poVar2 = std::operator<<(poVar2,(string *)&stack0xffffffffffffffc8);
  std::operator<<(poVar2,"\" ");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)local_58);
  poVar2 = std::operator<<((ostream *)&this->field_0x80,"name=\"");
  p_Var1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,(char *)p_Var1,&local_a9);
  escape((xunit_reporter *)local_88,(string *)this);
  poVar2 = std::operator<<(poVar2,(string *)local_88);
  std::operator<<(poVar2,"\" time=\"0\">\n");
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::operator<<((ostream *)&this->field_0x80,"\t\t<skipped />\n");
  std::operator<<((ostream *)&this->field_0x80,"\t</testcase>\n");
  return;
}

Assistant:

void it_skip(const char* desc)
    {
      progress_reporter::it_skip(desc);
      work_stm_ << "\t<testcase classname=\"" << escape(current_context_name()) << "\" ";
      work_stm_ << "name=\"" << escape(desc) << "\" time=\"0\">\n";
      work_stm_ << "\t\t<skipped />\n";
      work_stm_ << "\t</testcase>\n";
    }